

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestWriter.cpp
# Opt level: O2

void __thiscall
OpenMD::RestWriter::writeRest
          (RestWriter *this,
          vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
          *restInfo)

{
  byte bVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  pointer pmVar4;
  RealType RVar5;
  
  bVar1 = this->createRestFile_;
  if ((bool)bVar1 == true) {
    RVar5 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
    std::ostream::_M_insert<double>(RVar5);
    bVar1 = this->createRestFile_;
  }
  if ((bVar1 & 1) != 0) {
    for (pmVar4 = (restInfo->
                  super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pmVar4 != (restInfo->
                  super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pmVar4 = pmVar4 + 1) {
      for (p_Var3 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        std::operator<<(this->output_,"\t");
        poVar2 = std::ostream::_M_insert<double>((double)p_Var3[1]._M_parent);
        std::operator<<(poVar2,"\t");
        std::ostream::_M_insert<double>((double)p_Var3[1]._M_left);
      }
      std::endl<char,std::char_traits<char>>(this->output_);
    }
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void RestWriter::writeRest(
      std::vector<std::map<int, Restraint::RealPair>> restInfo) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

#ifndef IS_MPI
    if (createRestFile_)
      (*output_)
          << info_->getSnapshotManager()->getCurrentSnapshot()->getTime();

    // output some information about the molecules
    std::vector<std::map<int, Restraint::RealPair>>::const_iterator i;
    std::map<int, Restraint::RealPair>::const_iterator j;

    if (createRestFile_) {
      for (i = restInfo.begin(); i != restInfo.end(); ++i) {
        for (j = (*i).begin(); j != (*i).end(); ++j) {
          (*output_) << "\t" << (j->second).first << "\t" << (j->second).second;
        }
        (*output_) << std::endl;
      }
      (*output_).flush();
    }
#else
    std::string buffer, first, second;
    std::stringstream ss;

    std::vector<std::map<int, Restraint::RealPair>>::const_iterator i;
    std::map<int, Restraint::RealPair>::const_iterator j;

    if (createRestFile_) {
      for (i = restInfo.begin(); i != restInfo.end(); ++i) {
        for (j = (*i).begin(); j != (*i).end(); ++j) {
          ss.clear();
          ss << (j->second).first;
          ss >> first;
          ss.clear();
          ss << (j->second).second;
          ss >> second;
          buffer += ("\t" + first + "\t" + second);
        }
        buffer += "\n";
      }
    }

    const int primaryNode = 0;

    if (createRestFile_) {
      if (worldRank == primaryNode) {
        (*output_)
            << info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
        (*output_) << buffer;

        int nProc;
        MPI_Comm_size(MPI_COMM_WORLD, &nProc);
        for (int i = 1; i < nProc; ++i) {
          // receive the length of the string buffer that was
          // prepared by processor i

          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &istatus);
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, 0, MPI_COMM_WORLD,
                     &istatus);
            if (createRestFile_) (*output_) << recvBuffer;

            delete[] recvBuffer;
          }
        }
        (*output_).flush();
      } else {
        int sendBufferLength = buffer.size() + 1;
        MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR, primaryNode,
                 0, MPI_COMM_WORLD);
      }
    }
#endif  // is_mpi
  }